

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int TestRegEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                   _func_int_uchar_ptr_x86Reg *fun)

{
  x86Reg reg1;
  int iVar1;
  long lVar2;
  uchar *puVar3;
  int local_38;
  
  puVar3 = stream;
  for (lVar2 = 0; lVar2 != 0x24; lVar2 = lVar2 + 4) {
    reg1 = *(x86Reg *)((long)testRegs + lVar2);
    EMIT_OP_REG(ctx,op,reg1);
    iVar1 = (*fun)(puVar3,reg1);
    puVar3 = puVar3 + iVar1;
  }
  local_38 = (int)stream;
  return (int)puVar3 - local_38;
}

Assistant:

int TestRegEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg reg))
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		EMIT_OP_REG(ctx, op, testRegs[reg]);
		stream += fun(stream, testRegs[reg]);
	}

	return int(stream - start);
}